

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Service_Request_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Service_Request_PDU::Decode
          (Service_Request_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT8 *V;
  byte bVar1;
  KUINT16 KVar2;
  KException *pKVar3;
  int iVar4;
  undefined7 in_register_00000011;
  ushort uVar5;
  Supplies sup;
  undefined1 local_48 [32];
  
  KVar2 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (0x1b < iVar4 + (uint)KVar2) {
    Logistics_Header::Decode((Logistics_Header *)this,stream,ignoreHeader);
    KDataStream::Read(stream,&this->m_ui8ServiceTypeRequested);
    V = &(this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes;
    KDataStream::Read(stream,V);
    KDataStream::Read<unsigned_short>(stream,&(this->super_Resupply_Received_PDU).m_ui16Padding1);
    KVar2 = KDataStream::GetBufferSize(stream);
    bVar1 = (this->super_Resupply_Received_PDU).m_ui8NumSupplyTypes;
    if ((ushort)((ushort)bVar1 * 0xc) <= KVar2) {
      if (bVar1 != 0) {
        uVar5 = 0;
        do {
          DATA_TYPE::Supplies::Supplies((Supplies *)local_48);
          (**(_func_int **)(local_48._0_8_ + 0x18))(local_48,stream);
          std::vector<KDIS::DATA_TYPE::Supplies,_std::allocator<KDIS::DATA_TYPE::Supplies>_>::
          push_back(&(this->super_Resupply_Received_PDU).m_vSupplies,(value_type *)local_48);
          DATA_TYPE::Supplies::~Supplies((Supplies *)local_48);
          uVar5 = uVar5 + 1;
        } while (uVar5 < *V);
      }
      return;
    }
    pKVar3 = (KException *)__cxa_allocate_exception(0x30);
    local_48._0_8_ = local_48 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Decode","");
    KException::KException(pKVar3,(KString *)local_48,0x1c);
    __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
  }
  pKVar3 = (KException *)__cxa_allocate_exception(0x30);
  local_48._0_8_ = local_48 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"Decode","");
  KException::KException(pKVar3,(KString *)local_48,2);
  __cxa_throw(pKVar3,&KException::typeinfo,KException::~KException);
}

Assistant:

void Service_Request_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < SERVICE_REQUEST_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Logistics_Header::Decode( stream, ignoreHeader );

    stream >> m_ui8ServiceTypeRequested
           >> m_ui8NumSupplyTypes
           >> m_ui16Padding1;

    // Now recheck the size of the packet as we now know the number of supply types.
    if( stream.GetBufferSize() < m_ui8NumSupplyTypes * Supplies::SUPPLIES_SIZE )throw KException( __FUNCTION__, RESUPPLY_RECEIVED_PDU_SIZE );

    for( KUINT16 i = 0; i < m_ui8NumSupplyTypes; ++i )
    {
        Supplies sup;
        stream >> KDIS_STREAM sup;
        m_vSupplies.push_back( sup );
    }
}